

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

uint __thiscall UnifiedRegex::CharSetLeaf::Count(CharSetLeaf *this,uint level)

{
  code *pcVar1;
  bool bVar2;
  uint n;
  uint uVar3;
  undefined4 *puVar4;
  int w;
  long lVar5;
  
  if (level != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x33a,"(level == 0)","level == 0");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  lVar5 = 0;
  uVar3 = 0;
  do {
    uVar3 = uVar3 + POPCOUNT((this->vec).vec[lVar5]);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 8);
  return uVar3;
}

Assistant:

uint CharSetLeaf::Count(uint level) const
    {
        Assert(level == 0);
        return vec.Count();
    }